

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O0

array<unsigned_char,_3UL> gen_color(Color pixel_color,int n_samples)

{
  array<unsigned_char,_3UL> aVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  _Type local_44;
  double color_max;
  double color_min;
  double rcp_samples;
  double b;
  double g;
  double r;
  int n_samples_local;
  
  dVar2 = Vec3::x(&pixel_color);
  dVar3 = Vec3::y(&pixel_color);
  dVar4 = Vec3::z(&pixel_color);
  dVar5 = 1.0 / (double)n_samples;
  dVar2 = pow(dVar2 * dVar5,0.45454545454545453);
  dVar3 = pow(dVar3 * dVar5,0.45454545454545453);
  dVar4 = pow(dVar4 * dVar5,0.45454545454545453);
  dVar2 = clamp(dVar2,0.0,0.999);
  dVar3 = clamp(dVar3,0.0,0.999);
  dVar4 = clamp(dVar4,0.0,0.999);
  aVar1._M_elems[0] = (char)(int)(dVar2 * 256.0);
  aVar1._M_elems[1] = (char)(int)(dVar3 * 256.0);
  aVar1._M_elems[2] = (uchar)(int)(dVar4 * 256.0);
  return (array<unsigned_char,_3UL>)aVar1._M_elems;
}

Assistant:

std::array<uint8_t, 3> gen_color( Color pixel_color, int n_samples) {
  double r = pixel_color.x();
  double g = pixel_color.y();
  double b = pixel_color.z();

  // Divide by the total number of samples per pixel
  auto rcp_samples = 1.0 / n_samples;
  r *= rcp_samples;
  g *= rcp_samples;
  b *= rcp_samples;

  // Gamma correction: adjusting for perceived brightness vs. linear brightness
  r = std::pow(r, RCP_GAMMA);
  g = std::pow(g, RCP_GAMMA);
  b = std::pow(b, RCP_GAMMA);
  const double color_min = 0.0;
  const double color_max = 0.999;
  return {static_cast<uint8_t>(RGB_MAX * clamp(r, color_min, color_max)),
          static_cast<uint8_t>(RGB_MAX * clamp(g, color_min, color_max)),
          static_cast<uint8_t>(RGB_MAX * clamp(b, color_min, color_max))};
}